

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::async_get
          (coro_http_client *this,string *uri,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  resp_data *data;
  undefined8 in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000340;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000348;
  http_method in_stack_00000354;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000358;
  coro_http_client *in_stack_00000360;
  span<char,_18446744073709551615UL> *in_stack_00000390;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffab8;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value;
  LazyPromise<cinatra::resp_data> *in_stack_fffffffffffffac0;
  LazyPromise<cinatra::resp_data> *this_00;
  LazyPromiseBase *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  
  puVar2 = (undefined8 *)operator_new(0x370,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = async_get;
    puVar2[1] = async_get;
    data = (resp_data *)(puVar2 + 0x32);
    puVar2[0x6c] = in_RSI;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffac0,
                    (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffab8);
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
              (in_stack_fffffffffffffac0);
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x36d));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x36d));
      std::error_code::error_code((error_code *)in_stack_fffffffffffffac0);
      *(undefined4 *)(puVar2 + 0x34) = 0;
      *(undefined1 *)((long)puVar2 + 0x1a4) = 0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(puVar2 + 0x35));
      std::span<cinatra::http_header,_18446744073709551615UL>::span
                ((span<cinatra::http_header,_18446744073709551615UL> *)0x22ee4e);
      *(undefined4 *)(puVar2 + 0xd) = 9;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
      puVar2[0x16] = 0;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffac0,
                      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffab8);
      std::span<char,_18446744073709551615UL>::span((span<char,_18446744073709551615UL> *)0x22eed2);
      value = (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)puVar2[0x61];
      this_00 = (LazyPromise<cinatra::resp_data> *)puVar2[0x62];
      async_request<std::__cxx11::string,std::__cxx11::string>
                (in_stack_00000360,in_stack_00000358,in_stack_00000354,in_stack_00000348,
                 in_stack_00000340,in_stack_00000390);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                (in_stack_fffffffffffffac8,(Lazy<cinatra::resp_data> *)this_00);
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                        ((LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x67));
      if (bVar1) {
        puVar2[0x65] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x67);
        async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                  ((LazyAwaiterBase<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        memcpy(data,puVar2 + 0x39,0x38);
        async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x22f09a);
        async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x22f0a7);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x22f0b4);
        req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x22f103)
        ;
        if ((bVar1) || (bVar1 = is_redirect((coro_http_client *)puVar2[0x6c],data), !bVar1)) {
          async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
          return_value<cinatra::resp_data>(this_00,(resp_data *)value);
        }
        else {
          if ((*(byte *)(puVar2[0x6c] + 0xfc8) & 1) != 0) {
            std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
            req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this_00,value);
            puVar2[0x52] = 0;
            puVar2[0x53] = 0;
            puVar2[0x50] = 0;
            puVar2[0x51] = 0;
            puVar2[0x4e] = 0;
            puVar2[0x4f] = 0;
            puVar2[0x54] = 0;
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)0x22f211);
            std::span<char,_18446744073709551615UL>::span
                      ((span<char,_18446744073709551615UL> *)0x22f21e);
            value = (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)puVar2[99];
            this_00 = (LazyPromise<cinatra::resp_data> *)puVar2[100];
            async_request<std::__cxx11::string,std::__cxx11::string>
                      (in_stack_00000360,in_stack_00000358,in_stack_00000354,in_stack_00000348,
                       in_stack_00000340,in_stack_00000390);
            async_simple::coro::detail::LazyPromiseBase::
            await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                      (in_stack_fffffffffffffac8,(Lazy<cinatra::resp_data> *)this_00);
            bVar1 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                              ((LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x6a));
            if (!bVar1) {
              *(undefined1 *)((long)puVar2 + 0x36c) = 2;
              async_get((void *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                        (void *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
              (*(code *)*extraout_RAX_00)(extraout_RAX_00);
              return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
            }
            puVar2[0x66] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x6a);
            async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                      ((LazyAwaiterBase<cinatra::resp_data> *)
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
            memcpy(data,puVar2 + 0x47,0x38);
            async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::
            ~ValueAwaiter((ValueAwaiter *)0x22f3ce);
            async_simple::coro::Lazy<cinatra::resp_data>::~Lazy
                      ((Lazy<cinatra::resp_data> *)0x22f3db);
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)0x22f3e8);
            req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)this_00);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
            ;
          }
          async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
          return_value<cinatra::resp_data>(this_00,(resp_data *)value);
        }
        req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00);
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar2 + 2));
        bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar2 + 0x36e));
        if (bVar1) {
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0x36e));
          async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
                    ((LazyPromise<cinatra::resp_data> *)0x22f609);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)0x22f616);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
          if (puVar2 != (undefined8 *)0x0) {
            operator_delete(puVar2,0x370);
          }
        }
        else {
          *puVar2 = 0;
          *(undefined1 *)((long)puVar2 + 0x36c) = 3;
          async_get((void *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                    in_stack_fffffffffffffac8);
          (*(code *)*extraout_RAX_01)(extraout_RAX_01);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0x36c) = 1;
        async_get((void *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                  (void *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0x36c) = 0;
      async_get((void *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                in_stack_fffffffffffffac8);
    }
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_get(
      std::string uri,
      std::unordered_map<std::string, std::string> headers = {}) {
    resp_data data{};
    req_context<> ctx{};
    data = co_await async_request(std::move(uri), http_method::GET,
                                  std::move(ctx), std::move(headers));
#ifdef BENCHMARK_TEST
    data.total = total_len_;
#endif
    if (redirect_uri_.empty() || !is_redirect(data)) {
      co_return data;
    }
    else {
      if (enable_follow_redirect_)
        data = co_await async_request(std::move(redirect_uri_),
                                      http_method::GET, std::move(ctx));
      co_return data;
    }
  }